

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

bool __thiscall BaseIndex::BlockUntilSyncedToCurrentChain(BaseIndex *this)

{
  __int_type_conflict _Var1;
  long lVar2;
  CBlockIndex *pCVar3;
  int iVar4;
  CBlockIndex *pCVar5;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1 = (this->m_synced)._M_base._M_i;
  if ((_Var1 & 1U) != 0) {
    criticalblock14.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    criticalblock14.super_unique_lock._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock14.super_unique_lock);
    pCVar3 = (this->m_chainstate->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    pCVar5 = CBlockIndex::GetAncestor((this->m_best_block_index)._M_b._M_p,pCVar3->nHeight);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock14.super_unique_lock);
    if (pCVar5 != pCVar3) {
      logging_function._M_str = "BlockUntilSyncedToCurrentChain";
      logging_function._M_len = 0x1e;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<char[31],std::__cxx11::string>
                (logging_function,source_file,0x188,ALL,Info,(ConstevalFormatString<2U>)0x81875f,
                 (char (*) [31])"BlockUntilSyncedToCurrentChain",&this->m_name);
      iVar4 = (*((this->m_chain)._M_t.
                 super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                 .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[0x36]
              )();
      ValidationSignals::SyncWithValidationInterfaceQueue
                (*(ValidationSignals **)(CONCAT44(extraout_var,iVar4) + 0xe0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)(_Var1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::BlockUntilSyncedToCurrentChain() const
{
    AssertLockNotHeld(cs_main);

    if (!m_synced) {
        return false;
    }

    {
        // Skip the queue-draining stuff if we know we're caught up with
        // m_chain.Tip().
        LOCK(cs_main);
        const CBlockIndex* chain_tip = m_chainstate->m_chain.Tip();
        const CBlockIndex* best_block_index = m_best_block_index.load();
        if (best_block_index->GetAncestor(chain_tip->nHeight) == chain_tip) {
            return true;
        }
    }

    LogPrintf("%s: %s is catching up on block notifications\n", __func__, GetName());
    m_chain->context()->validation_signals->SyncWithValidationInterfaceQueue();
    return true;
}